

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

Status __thiscall leveldb::ModelDB::Write(ModelDB *this,WriteOptions *options,WriteBatch *batch)

{
  KVMap *in_RCX;
  undefined1 local_38 [8];
  Handler handler;
  WriteBatch *batch_local;
  WriteOptions *options_local;
  ModelDB *this_local;
  
  handler.map_ = in_RCX;
  Write::Handler::Handler((Handler *)local_38);
  handler.super_Handler._vptr_Handler = (_func_int **)(options + 0x68);
  WriteBatch::Iterate((WriteBatch *)this,(Handler *)handler.map_);
  Write::Handler::~Handler((Handler *)local_38);
  return (Status)(char *)this;
}

Assistant:

Status Write(const WriteOptions& options, WriteBatch* batch) override {
    class Handler : public WriteBatch::Handler {
     public:
      KVMap* map_;
      void Put(const Slice& key, const Slice& value) override {
        (*map_)[key.ToString()] = value.ToString();
      }
      void Delete(const Slice& key) override { map_->erase(key.ToString()); }
    };
    Handler handler;
    handler.map_ = &map_;
    return batch->Iterate(&handler);
  }